

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O1

uint32_t __thiscall CompressedArray::calculate_value_size(CompressedArray *this,Value value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  undefined8 local_28;
  uint32_t local_20 [2];
  
  local_20[0] = value.unique_continuations_count;
  local_28 = value._0_8_;
  uVar2 = Vocabulary<unsigned_int>::get_index(&this->ngram_count_values,(uint *)&local_28);
  uVar1 = this->ngram_count_index_log_radix;
  iVar5 = -uVar1;
  iVar4 = 0;
  do {
    bVar3 = (byte)iVar4;
    iVar5 = iVar5 + uVar1 + 1;
    iVar4 = iVar4 + uVar1;
  } while (uVar2 >> (bVar3 & 0x3f) != 0);
  uVar2 = Vocabulary<unsigned_int>::get_index
                    (&this->continuations_count_values,(uint *)((long)&local_28 + 4));
  uVar1 = this->continuations_count_index_log_radix;
  iVar5 = iVar5 - uVar1;
  iVar4 = 0;
  do {
    bVar3 = (byte)iVar4;
    iVar5 = iVar5 + uVar1 + 1;
    iVar4 = iVar4 + uVar1;
  } while (uVar2 >> (bVar3 & 0x3f) != 0);
  uVar2 = Vocabulary<unsigned_int>::get_index(&this->unique_continuations_count_values,local_20);
  uVar1 = this->unique_continuations_count_index_log_radix;
  uVar6 = iVar5 - uVar1;
  iVar4 = 0;
  do {
    bVar3 = (byte)iVar4;
    uVar6 = uVar6 + uVar1 + 1;
    iVar4 = iVar4 + uVar1;
  } while (uVar2 >> (bVar3 & 0x3f) != 0);
  return uVar6;
}

Assistant:

uint32_t CompressedArray::calculate_value_size(Value value) const {
    uint32_t size = 0;
    uint32_t index = ngram_count_values.get_index(value.ngram_count);
    size += calculate_number_size(index, ngram_count_index_log_radix);
    index = continuations_count_values.get_index(value.continuations_count);
    size += calculate_number_size(index, continuations_count_index_log_radix);
    index = unique_continuations_count_values.get_index(value.unique_continuations_count);
    size += calculate_number_size(index, unique_continuations_count_index_log_radix);
    return size;
}